

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

ostream * __thiscall wasm::String::printEscapedJSON(String *this,ostream *os,string_view str)

{
  uint codePoint;
  size_type sVar1;
  uint *puVar2;
  ostream *poVar3;
  bool local_3d;
  anon_class_8_1_3fcf66a2 local_38;
  anon_class_8_1_3fcf66a2 printEscape;
  bool isNaivelyPrintable;
  uint u;
  ostream *os_local;
  string_view str_local;
  
  str_local._M_len = str._M_len;
  os_local = os;
  std::operator<<((ostream *)this,'\"');
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         &os_local);
                      if (sVar1 == 0) {
                        poVar3 = std::operator<<((ostream *)this,'\"');
                        return poVar3;
                      }
                      register0x00000000 =
                           (_Optional_payload_base<unsigned_int>)
                           anon_unknown_0::takeWTF16CodePoint((string_view *)&os_local,true);
                      puVar2 = std::optional<unsigned_int>::operator*
                                         ((optional<unsigned_int> *)((long)&printEscape.os + 4));
                      codePoint = *puVar2;
                      if (codePoint != 8) break;
                      std::operator<<((ostream *)this,"\\b");
                    }
                    if (codePoint != 9) break;
                    std::operator<<((ostream *)this,"\\t");
                  }
                  if (codePoint != 10) break;
                  std::operator<<((ostream *)this,"\\n");
                }
                if (codePoint != 0xc) break;
                std::operator<<((ostream *)this,"\\f");
              }
              if (codePoint != 0xd) break;
              std::operator<<((ostream *)this,"\\r");
            }
            if (codePoint != 0x22) break;
            std::operator<<((ostream *)this,"\\\"");
          }
          if (codePoint != 0x5c) break;
          std::operator<<((ostream *)this,"\\\\");
        }
        local_3d = 0x1f < codePoint && codePoint < 0x7f;
        printEscape.os._3_1_ = local_3d;
        if (0x1f >= codePoint || codePoint >= 0x7f) break;
        if (0x7f < codePoint) {
          __assert_fail("u < 0x80 && \"need additional logic to emit valid UTF-8\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/string.cpp"
                        ,0x18e,
                        "std::ostream &wasm::String::printEscapedJSON(std::ostream &, std::string_view)"
                       );
        }
        std::operator<<((ostream *)this,(uchar)codePoint);
      }
      local_38.os = (ostream *)this;
      if (0xffff < codePoint) break;
      printEscapedJSON::anon_class_8_1_3fcf66a2::operator()(&local_38,codePoint);
    }
    if (0x10ffff < codePoint) break;
    printEscapedJSON::anon_class_8_1_3fcf66a2::operator()
              (&local_38,(codePoint - 0x10000 >> 10) + 0xd800);
    printEscapedJSON::anon_class_8_1_3fcf66a2::operator()
              (&local_38,(codePoint - 0x10000 & 0x3ff) + 0xdc00);
  }
  __assert_fail("u <= 0x10FFFF && \"unexpectedly high code point\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/string.cpp"
                ,0x1a1,
                "std::ostream &wasm::String::printEscapedJSON(std::ostream &, std::string_view)");
}

Assistant:

std::ostream& printEscapedJSON(std::ostream& os, std::string_view str) {
  os << '"';
  while (str.size()) {
    auto u = *takeWTF16CodePoint(str);

    // Use escape sequences mandated by the JSON spec.
    switch (u) {
      case '"':
        os << "\\\"";
        continue;
      case '\\':
        os << "\\\\";
        continue;
      case '\b':
        os << "\\b";
        continue;
      case '\f':
        os << "\\f";
        continue;
      case '\n':
        os << "\\n";
        continue;
      case '\r':
        os << "\\r";
        continue;
      case '\t':
        os << "\\t";
        continue;
      default:
        break;
    }

    // TODO: To minimize size, consider additionally escaping only other control
    // characters (u <= 0x1F) and surrogates, emitting everything else directly
    // assuming a UTF-8 encoding of the JSON text. We don't do this now because
    // Print.cpp would consider the contents unprintable, messing up our test.
    bool isNaivelyPrintable = 32 <= u && u < 127;
    if (isNaivelyPrintable) {
      assert(u < 0x80 && "need additional logic to emit valid UTF-8");
      os << uint8_t(u);
      continue;
    }

    // Escape as '\uXXXX` for code points less than 0x10000 or as a
    // '\uXXXX\uYYYY' surrogate pair otherwise.
    auto printEscape = [&os](uint32_t codePoint) {
      assert(codePoint < 0x10000);
      os << std::hex << "\\u";
      os << ((codePoint & 0xF000) >> 12);
      os << ((codePoint & 0x0F00) >> 8);
      os << ((codePoint & 0x00F0) >> 4);
      os << (codePoint & 0x000F);
      os << std::dec;
    };
    if (u < 0x10000) {
      printEscape(u);
    } else {
      assert(u <= 0x10FFFF && "unexpectedly high code point");
      printEscape(0xD800 + ((u - 0x10000) >> 10));
      printEscape(0xDC00 + ((u - 0x10000) & 0x3FF));
    }
  }
  return os << '"';
}